

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void av1_dr_prediction_z1_avx2
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int dx,int dy)

{
  uint8_t uVar1;
  ushort uVar2;
  undefined8 uVar3;
  ulong uVar4;
  long lVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  undefined1 (*pauVar13) [16];
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ushort uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined8 local_438 [129];
  
  uVar4 = (ulong)(uint)bh;
  if (bw == 0x40) {
    dr_prediction_z1_64xN_avx2(bh,dst,stride,above,dx,(int)left);
    return;
  }
  bVar6 = (byte)upsample_above;
  if (bw == 8) {
    iVar14 = bh + 7 << (bVar6 & 0x1f);
    uVar1 = above[iVar14];
    auVar15[1] = uVar1;
    auVar15[0] = uVar1;
    auVar15[2] = uVar1;
    auVar15[3] = uVar1;
    auVar15[4] = uVar1;
    auVar15[5] = uVar1;
    auVar15[6] = uVar1;
    auVar15[7] = uVar1;
    auVar15[8] = uVar1;
    auVar15[9] = uVar1;
    auVar15[10] = uVar1;
    auVar15[0xb] = uVar1;
    auVar15[0xc] = uVar1;
    auVar15[0xd] = uVar1;
    auVar15[0xe] = uVar1;
    auVar15[0xf] = uVar1;
    uVar8 = 0;
    uVar7 = 0;
    if (0 < bh) {
      uVar7 = uVar4;
    }
    pauVar13 = (undefined1 (*) [16])local_438;
    auVar25._8_2_ = 0x10;
    auVar25._0_8_ = 0x10001000100010;
    auVar25._10_2_ = 0x10;
    auVar25._12_2_ = 0x10;
    auVar25._14_2_ = 0x10;
    auVar25._16_2_ = 0x10;
    auVar25._18_2_ = 0x10;
    auVar25._20_2_ = 0x10;
    auVar25._22_2_ = 0x10;
    auVar25._24_2_ = 0x10;
    auVar25._26_2_ = 0x10;
    auVar25._28_2_ = 0x10;
    auVar25._30_2_ = 0x10;
    auVar19._8_2_ = 0x1f;
    auVar19._0_8_ = 0x1f001f001f001f;
    auVar19._10_2_ = 0x1f;
    auVar19._12_2_ = 0x1f;
    auVar19._14_2_ = 0x1f;
    auVar19._16_2_ = 0x1f;
    auVar19._18_2_ = 0x1f;
    auVar19._20_2_ = 0x1f;
    auVar19._22_2_ = 0x1f;
    auVar19._24_2_ = 0x1f;
    auVar19._26_2_ = 0x1f;
    auVar19._28_2_ = 0x1f;
    auVar19._30_2_ = 0x1f;
    uVar11 = dx;
    while( true ) {
      if (uVar7 == uVar8) goto LAB_002f7ec5;
      iVar12 = (int)uVar11 >> (6 - bVar6 & 0x1f);
      uVar9 = iVar14 - iVar12 >> (bVar6 & 0x1f);
      if ((int)uVar9 < 1) break;
      if (7 < uVar9) {
        uVar9 = 8;
      }
      auVar21 = *(undefined1 (*) [16])(above + iVar12);
      if (upsample_above == 0) {
        auVar22 = *(undefined1 (*) [16])(above + (long)iVar12 + 1);
        uVar2 = (ushort)(uVar11 >> 1);
        uVar23 = uVar2 & 0x1f;
        auVar28._0_8_ = CONCAT26(uVar2,CONCAT24(uVar2,CONCAT22(uVar2,uVar2))) & 0x1f001f001f001f;
        auVar28._8_2_ = uVar23;
        auVar28._10_2_ = uVar23;
        auVar28._12_2_ = uVar23;
        auVar28._14_2_ = uVar23;
        auVar28._16_2_ = uVar23;
        auVar28._18_2_ = uVar23;
        auVar28._20_2_ = uVar23;
        auVar28._22_2_ = uVar23;
        auVar28._24_2_ = uVar23;
        auVar28._26_2_ = uVar23;
        auVar28._28_2_ = uVar23;
        auVar28._30_2_ = uVar23;
      }
      else {
        auVar21 = vpshufb_avx(auVar21,_DAT_00468b70);
        auVar22 = vpsrldq_avx(auVar21,8);
        auVar27._0_2_ = (undefined2)uVar11;
        auVar27._2_2_ = auVar27._0_2_;
        auVar27._4_2_ = auVar27._0_2_;
        auVar27._6_2_ = auVar27._0_2_;
        auVar27._8_2_ = auVar27._0_2_;
        auVar27._10_2_ = auVar27._0_2_;
        auVar27._12_2_ = auVar27._0_2_;
        auVar27._14_2_ = auVar27._0_2_;
        auVar27._16_2_ = auVar27._0_2_;
        auVar27._18_2_ = auVar27._0_2_;
        auVar27._20_2_ = auVar27._0_2_;
        auVar27._22_2_ = auVar27._0_2_;
        auVar27._24_2_ = auVar27._0_2_;
        auVar27._26_2_ = auVar27._0_2_;
        auVar27._28_2_ = auVar27._0_2_;
        auVar27._30_2_ = auVar27._0_2_;
        auVar28 = vpsllw_avx2(auVar27,ZEXT416((uint)upsample_above));
        auVar28 = vpsrlw_avx2(auVar28,1);
        auVar28 = vpand_avx2(auVar28,auVar19);
      }
      auVar27 = vpmovzxbw_avx2(auVar21);
      auVar17 = vpmovzxbw_avx2(auVar22);
      auVar17 = vpsubw_avx2(auVar17,auVar27);
      auVar17 = vpmullw_avx2(auVar17,auVar28);
      auVar28 = vpsllw_avx2(auVar27,5);
      auVar28 = vpaddw_avx2(auVar28,auVar25);
      auVar28 = vpaddw_avx2(auVar17,auVar28);
      auVar28 = vpsrlw_avx2(auVar28,5);
      auVar21 = vpackuswb_avx(auVar28._0_16_,auVar28._16_16_);
      auVar21 = vpblendvb_avx(auVar15,auVar21,*(undefined1 (*) [16])BaseMask[uVar9]);
      *pauVar13 = auVar21;
      uVar11 = uVar11 + dx;
      uVar8 = uVar8 + 1;
      pauVar13 = pauVar13 + 1;
    }
    if (bh <= (int)uVar8) {
      uVar4 = uVar8 & 0xffffffff;
    }
    for (; uVar8 != uVar4; uVar4 = uVar4 - 1) {
      *pauVar13 = auVar15;
      pauVar13 = pauVar13 + 1;
    }
LAB_002f7ec5:
    for (lVar5 = 0; uVar7 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
      *(undefined8 *)dst = *(undefined8 *)((long)local_438 + lVar5);
      dst = dst + stride;
    }
    return;
  }
  if (bw == 0x10) {
    iVar14 = bh + 0xf << (bVar6 & 0x1f);
    uVar1 = above[iVar14];
    auVar21[1] = uVar1;
    auVar21[0] = uVar1;
    auVar21[2] = uVar1;
    auVar21[3] = uVar1;
    auVar21[4] = uVar1;
    auVar21[5] = uVar1;
    auVar21[6] = uVar1;
    auVar21[7] = uVar1;
    auVar21[8] = uVar1;
    auVar21[9] = uVar1;
    auVar21[10] = uVar1;
    auVar21[0xb] = uVar1;
    auVar21[0xc] = uVar1;
    auVar21[0xd] = uVar1;
    auVar21[0xe] = uVar1;
    auVar21[0xf] = uVar1;
    uVar8 = 0;
    uVar7 = 0;
    if (0 < bh) {
      uVar7 = uVar4;
    }
    pauVar13 = (undefined1 (*) [16])local_438;
    auVar17._8_2_ = 0x10;
    auVar17._0_8_ = 0x10001000100010;
    auVar17._10_2_ = 0x10;
    auVar17._12_2_ = 0x10;
    auVar17._14_2_ = 0x10;
    auVar17._16_2_ = 0x10;
    auVar17._18_2_ = 0x10;
    auVar17._20_2_ = 0x10;
    auVar17._22_2_ = 0x10;
    auVar17._24_2_ = 0x10;
    auVar17._26_2_ = 0x10;
    auVar17._28_2_ = 0x10;
    auVar17._30_2_ = 0x10;
    auVar20._8_2_ = 0x1f;
    auVar20._0_8_ = 0x1f001f001f001f;
    auVar20._10_2_ = 0x1f;
    auVar20._12_2_ = 0x1f;
    auVar20._14_2_ = 0x1f;
    auVar20._16_2_ = 0x1f;
    auVar20._18_2_ = 0x1f;
    auVar20._20_2_ = 0x1f;
    auVar20._22_2_ = 0x1f;
    auVar20._24_2_ = 0x1f;
    auVar20._26_2_ = 0x1f;
    auVar20._28_2_ = 0x1f;
    auVar20._30_2_ = 0x1f;
    uVar11 = dx;
    while( true ) {
      if (uVar7 == uVar8) goto LAB_002f7ef9;
      iVar12 = (int)uVar11 >> (6 - bVar6 & 0x1f);
      uVar9 = iVar14 - iVar12 >> (bVar6 & 0x1f);
      if ((int)uVar9 < 1) break;
      if (0xf < uVar9) {
        uVar9 = 0x10;
      }
      auVar15 = *(undefined1 (*) [16])(above + iVar12);
      if (upsample_above == 0) {
        auVar22 = *(undefined1 (*) [16])(above + (long)iVar12 + 1);
        uVar2 = (ushort)(uVar11 >> 1);
        uVar23 = uVar2 & 0x1f;
        auVar30._0_8_ = CONCAT26(uVar2,CONCAT24(uVar2,CONCAT22(uVar2,uVar2))) & 0x1f001f001f001f;
        auVar30._8_2_ = uVar23;
        auVar30._10_2_ = uVar23;
        auVar30._12_2_ = uVar23;
        auVar30._14_2_ = uVar23;
        auVar30._16_2_ = uVar23;
        auVar30._18_2_ = uVar23;
        auVar30._20_2_ = uVar23;
        auVar30._22_2_ = uVar23;
        auVar30._24_2_ = uVar23;
        auVar30._26_2_ = uVar23;
        auVar30._28_2_ = uVar23;
        auVar30._30_2_ = uVar23;
      }
      else {
        auVar15 = vpshufb_avx(auVar15,_DAT_00468b70);
        auVar22 = vpsrldq_avx(auVar15,8);
        auVar29._0_2_ = (undefined2)uVar11;
        auVar29._2_2_ = auVar29._0_2_;
        auVar29._4_2_ = auVar29._0_2_;
        auVar29._6_2_ = auVar29._0_2_;
        auVar29._8_2_ = auVar29._0_2_;
        auVar29._10_2_ = auVar29._0_2_;
        auVar29._12_2_ = auVar29._0_2_;
        auVar29._14_2_ = auVar29._0_2_;
        auVar29._16_2_ = auVar29._0_2_;
        auVar29._18_2_ = auVar29._0_2_;
        auVar29._20_2_ = auVar29._0_2_;
        auVar29._22_2_ = auVar29._0_2_;
        auVar29._24_2_ = auVar29._0_2_;
        auVar29._26_2_ = auVar29._0_2_;
        auVar29._28_2_ = auVar29._0_2_;
        auVar29._30_2_ = auVar29._0_2_;
        auVar25 = vpsllw_avx2(auVar29,ZEXT416((uint)upsample_above));
        auVar25 = vpsrlw_avx2(auVar25,1);
        auVar30 = vpand_avx2(auVar25,auVar20);
      }
      auVar25 = vpmovzxbw_avx2(auVar15);
      auVar19 = vpmovzxbw_avx2(auVar22);
      auVar19 = vpsubw_avx2(auVar19,auVar25);
      auVar19 = vpmullw_avx2(auVar19,auVar30);
      auVar25 = vpsllw_avx2(auVar25,5);
      auVar25 = vpaddw_avx2(auVar25,auVar17);
      auVar25 = vpaddw_avx2(auVar19,auVar25);
      auVar25 = vpsrlw_avx2(auVar25,5);
      auVar15 = vpackuswb_avx(auVar25._0_16_,auVar25._16_16_);
      auVar15 = vpblendvb_avx(auVar21,auVar15,*(undefined1 (*) [16])BaseMask[uVar9]);
      *pauVar13 = auVar15;
      uVar11 = uVar11 + dx;
      uVar8 = uVar8 + 1;
      pauVar13 = pauVar13 + 1;
    }
    if (bh <= (int)uVar8) {
      uVar4 = uVar8 & 0xffffffff;
    }
    for (; uVar8 != uVar4; uVar4 = uVar4 - 1) {
      *pauVar13 = auVar21;
      pauVar13 = pauVar13 + 1;
    }
LAB_002f7ef9:
    for (lVar5 = 0; uVar7 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
      uVar3 = *(undefined8 *)((long)local_438 + lVar5 + 8);
      *(undefined8 *)dst = *(undefined8 *)((long)local_438 + lVar5);
      *(undefined8 *)(dst + 8) = uVar3;
      dst = dst + stride;
    }
    return;
  }
  if (bw == 0x20) {
    dr_prediction_z1_32xN_avx2(bh,dst,stride,above,dx,(int)left);
    return;
  }
  if (bw != 4) {
    return;
  }
  iVar14 = bh + 3 << (bVar6 & 0x1f);
  uVar1 = above[iVar14];
  auVar22[1] = uVar1;
  auVar22[0] = uVar1;
  auVar22[2] = uVar1;
  auVar22[3] = uVar1;
  auVar22[4] = uVar1;
  auVar22[5] = uVar1;
  auVar22[6] = uVar1;
  auVar22[7] = uVar1;
  auVar22[8] = uVar1;
  auVar22[9] = uVar1;
  auVar22[10] = uVar1;
  auVar22[0xb] = uVar1;
  auVar22[0xc] = uVar1;
  auVar22[0xd] = uVar1;
  auVar22[0xe] = uVar1;
  auVar22[0xf] = uVar1;
  uVar8 = 0;
  uVar7 = 0;
  if (0 < bh) {
    uVar7 = (ulong)(uint)bh;
  }
  pauVar13 = (undefined1 (*) [16])local_438;
  auVar16._8_2_ = 0x10;
  auVar16._0_8_ = 0x10001000100010;
  auVar16._10_2_ = 0x10;
  auVar16._12_2_ = 0x10;
  auVar16._14_2_ = 0x10;
  auVar16._16_2_ = 0x10;
  auVar16._18_2_ = 0x10;
  auVar16._20_2_ = 0x10;
  auVar16._22_2_ = 0x10;
  auVar16._24_2_ = 0x10;
  auVar16._26_2_ = 0x10;
  auVar16._28_2_ = 0x10;
  auVar16._30_2_ = 0x10;
  auVar18._8_2_ = 0x1f;
  auVar18._0_8_ = 0x1f001f001f001f;
  auVar18._10_2_ = 0x1f;
  auVar18._12_2_ = 0x1f;
  auVar18._14_2_ = 0x1f;
  auVar18._16_2_ = 0x1f;
  auVar18._18_2_ = 0x1f;
  auVar18._20_2_ = 0x1f;
  auVar18._22_2_ = 0x1f;
  auVar18._24_2_ = 0x1f;
  auVar18._26_2_ = 0x1f;
  auVar18._28_2_ = 0x1f;
  auVar18._30_2_ = 0x1f;
  uVar11 = dx;
  while( true ) {
    if (uVar7 == uVar8) goto LAB_002f7f2f;
    iVar12 = (int)uVar11 >> (6 - bVar6 & 0x1f);
    uVar9 = iVar14 - iVar12 >> (bVar6 & 0x1f);
    if ((int)uVar9 < 1) break;
    uVar10 = (ulong)uVar9;
    if (3 < uVar9) {
      uVar10 = 4;
    }
    auVar15 = *(undefined1 (*) [16])(above + iVar12);
    if (upsample_above == 0) {
      auVar21 = *(undefined1 (*) [16])(above + (long)iVar12 + 1);
      uVar2 = (ushort)(uVar11 >> 1);
      uVar23 = uVar2 & 0x1f;
      auVar26._0_8_ = CONCAT26(uVar2,CONCAT24(uVar2,CONCAT22(uVar2,uVar2))) & 0x1f001f001f001f;
      auVar26._8_2_ = uVar23;
      auVar26._10_2_ = uVar23;
      auVar26._12_2_ = uVar23;
      auVar26._14_2_ = uVar23;
      auVar26._16_2_ = uVar23;
      auVar26._18_2_ = uVar23;
      auVar26._20_2_ = uVar23;
      auVar26._22_2_ = uVar23;
      auVar26._24_2_ = uVar23;
      auVar26._26_2_ = uVar23;
      auVar26._28_2_ = uVar23;
      auVar26._30_2_ = uVar23;
    }
    else {
      auVar15 = vpshufb_avx(auVar15,_DAT_00468b70);
      auVar21 = vpsrldq_avx(auVar15,8);
      auVar24._0_2_ = (undefined2)uVar11;
      auVar24._2_2_ = auVar24._0_2_;
      auVar24._4_2_ = auVar24._0_2_;
      auVar24._6_2_ = auVar24._0_2_;
      auVar24._8_2_ = auVar24._0_2_;
      auVar24._10_2_ = auVar24._0_2_;
      auVar24._12_2_ = auVar24._0_2_;
      auVar24._14_2_ = auVar24._0_2_;
      auVar24._16_2_ = auVar24._0_2_;
      auVar24._18_2_ = auVar24._0_2_;
      auVar24._20_2_ = auVar24._0_2_;
      auVar24._22_2_ = auVar24._0_2_;
      auVar24._24_2_ = auVar24._0_2_;
      auVar24._26_2_ = auVar24._0_2_;
      auVar24._28_2_ = auVar24._0_2_;
      auVar24._30_2_ = auVar24._0_2_;
      auVar25 = vpsllw_avx2(auVar24,ZEXT416((uint)upsample_above));
      auVar25 = vpsrlw_avx2(auVar25,1);
      auVar26 = vpand_avx2(auVar25,auVar18);
    }
    auVar25 = vpmovzxbw_avx2(auVar15);
    auVar19 = vpmovzxbw_avx2(auVar21);
    auVar19 = vpsubw_avx2(auVar19,auVar25);
    auVar19 = vpmullw_avx2(auVar19,auVar26);
    auVar25 = vpsllw_avx2(auVar25,5);
    auVar25 = vpaddw_avx2(auVar25,auVar16);
    auVar25 = vpaddw_avx2(auVar19,auVar25);
    auVar25 = vpsrlw_avx2(auVar25,5);
    auVar15 = vpackuswb_avx(auVar25._0_16_,auVar25._16_16_);
    auVar15 = vpblendvb_avx(auVar22,auVar15,*(undefined1 (*) [16])BaseMask[uVar10]);
    *pauVar13 = auVar15;
    uVar11 = uVar11 + dx;
    uVar8 = uVar8 + 1;
    pauVar13 = pauVar13 + 1;
  }
  if (bh <= (int)uVar8) {
    uVar4 = uVar8 & 0xffffffff;
  }
  for (; uVar8 != uVar4; uVar4 = uVar4 - 1) {
    *pauVar13 = auVar22;
    pauVar13 = pauVar13 + 1;
  }
LAB_002f7f2f:
  for (lVar5 = 0; uVar7 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
    *(undefined4 *)dst = *(undefined4 *)((long)local_438 + lVar5);
    dst = dst + stride;
  }
  return;
}

Assistant:

void av1_dr_prediction_z1_avx2(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                               const uint8_t *above, const uint8_t *left,
                               int upsample_above, int dx, int dy) {
  (void)left;
  (void)dy;
  switch (bw) {
    case 4:
      dr_prediction_z1_4xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    case 8:
      dr_prediction_z1_8xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    case 16:
      dr_prediction_z1_16xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    case 32:
      dr_prediction_z1_32xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    case 64:
      dr_prediction_z1_64xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    default: break;
  }
  return;
}